

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argvParser.cpp
# Opt level: O0

void __thiscall argvParser::printHelpMessage(argvParser *this,bool colored)

{
  bool bVar1;
  size_type sVar2;
  reference ppsVar3;
  reference ppaVar4;
  ostream *poVar5;
  ulong uVar6;
  string local_228 [32];
  string local_208 [32];
  string local_1e8 [32];
  string local_1c8 [32];
  undefined1 local_1a8 [128];
  undefined1 local_128 [40];
  argument *arg;
  string local_f8 [4];
  int argIndex;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8 [32];
  value_type local_b8;
  section *sec;
  string local_a8 [4];
  int secIndex;
  string requiredArgs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68 [48];
  string local_38 [8];
  string s;
  bool colored_local;
  argvParser *this_local;
  
  std::__cxx11::string::string(local_38);
  if (colored) {
    printGreen();
  }
  std::operator+(local_68,(char *)&(this->super_argParserAdvancedConfiguration).applicationName);
  std::__cxx11::string::operator+=(local_38,(string *)local_68);
  std::__cxx11::string::~string((string *)local_68);
  std::operator+(local_88,(char *)&this->description);
  std::__cxx11::string::operator+=(local_38,(string *)local_88);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::string(local_a8);
  for (sec._4_4_ = 0; uVar6 = (ulong)sec._4_4_,
      sVar2 = std::
              vector<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
              ::size((this->super_argParserAdvancedConfiguration).newargconfig), uVar6 < sVar2;
      sec._4_4_ = sec._4_4_ + 1) {
    ppsVar3 = std::
              vector<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
              ::at((this->super_argParserAdvancedConfiguration).newargconfig,(long)sec._4_4_);
    local_b8 = *ppsVar3;
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      std::operator+((char *)local_f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x116303);
      std::operator+(local_d8,(char *)local_f8);
      std::__cxx11::string::operator+=(local_38,(string *)local_d8);
      std::__cxx11::string::~string((string *)local_d8);
      std::__cxx11::string::~string(local_f8);
    }
    for (arg._4_4_ = 0; uVar6 = (ulong)arg._4_4_,
        sVar2 = std::
                vector<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
                ::size(local_b8->arguments), uVar6 < sVar2; arg._4_4_ = arg._4_4_ + 1) {
      ppaVar4 = std::
                vector<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
                ::at(local_b8->arguments,(long)arg._4_4_);
      local_128._32_8_ = *ppaVar4;
      std::__cxx11::string::string((string *)(local_1a8 + 0x60),(string *)local_128._32_8_);
      std::__cxx11::string::string((string *)(local_1a8 + 0x40),(string *)(local_128._32_8_ + 0x20))
      ;
      std::__cxx11::string::string((string *)(local_1a8 + 0x20),(string *)(local_128._32_8_ + 0x40))
      ;
      argParserAdvancedConfiguration::buildHelpLine
                ((argParserAdvancedConfiguration *)local_128,(string *)this,
                 (string *)(local_1a8 + 0x60),(string *)(local_1a8 + 0x40));
      std::__cxx11::string::operator+=(local_38,(string *)local_128);
      std::__cxx11::string::~string((string *)local_128);
      std::__cxx11::string::~string((string *)(local_1a8 + 0x20));
      std::__cxx11::string::~string((string *)(local_1a8 + 0x40));
      std::__cxx11::string::~string((string *)(local_1a8 + 0x60));
      if ((*(bool *)(local_128._32_8_ + 0xe8) & 1U) != 0) {
        std::__cxx11::string::string(local_1c8,(string *)local_128._32_8_);
        std::__cxx11::string::string(local_1e8,(string *)(local_128._32_8_ + 0x20));
        std::__cxx11::string::string(local_208,(string *)(local_128._32_8_ + 0x40));
        argParserAdvancedConfiguration::buildHelpLine
                  ((argParserAdvancedConfiguration *)local_1a8,(string *)this,(string *)local_1c8,
                   (string *)local_1e8);
        std::__cxx11::string::operator+=(local_a8,(string *)local_1a8);
        std::__cxx11::string::~string((string *)local_1a8);
        std::__cxx11::string::~string(local_208);
        std::__cxx11::string::~string(local_1e8);
        std::__cxx11::string::~string(local_1c8);
      }
    }
  }
  poVar5 = std::operator<<((ostream *)&std::cout,local_38);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  bVar1 = foundAllRequierdArgs(this);
  if (!bVar1) {
    if (colored) {
      printRed();
    }
    poVar5 = std::operator<<((ostream *)&std::cout,"\nrequired arguments are : \n");
    poVar5 = std::operator<<(poVar5,local_a8);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    if (colored) {
      resetCLI();
    }
  }
  if (colored) {
    printRed();
  }
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    poVar5 = std::operator<<((ostream *)&std::cout,"failed argument : \"");
    poVar5 = std::operator<<(poVar5,(string *)
                                    &(this->super_argParserAdvancedConfiguration).lastFailedArg);
    std::operator<<(poVar5,"\"");
  }
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    std::operator+((char *)local_228,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x116304);
    std::operator<<((ostream *)&std::cout,local_228);
    std::__cxx11::string::~string(local_228);
  }
  if (colored) {
    resetCLI();
  }
  poVar5 = (ostream *)
           std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void argvParser::printHelpMessage(bool colored) {
    string s;
    if (colored)
        printGreen();
    s += applicationName + "\n";
    s += description + "\nUsage:\n";
    string requiredArgs;
    for(int secIndex = 0; secIndex < newargconfig->size();secIndex++ ){
        section *sec = newargconfig->at(secIndex);
        if(!sec->sectionName.empty()){
            s+= "\n " + sec->sectionName + ": \n";
        }
        for(int argIndex = 0; argIndex<sec->arguments->size();argIndex++){
            argument * arg = sec->arguments->at(argIndex);
            s += buildHelpLine(arg->argShort,arg->argLong,arg->helpMessage);
            if(arg->requiredAndNotHitJet)
                requiredArgs += buildHelpLine(arg->argShort, arg->argLong, arg->helpMessage);
        }
    }
    cout << s<<endl;
    if (!foundAllRequierdArgs()) {
        if (colored)
            printRed();
        cout << "\nrequired arguments are : \n" << requiredArgs << endl;
        if (colored)
            resetCLI();
    }
    if (colored)
        printRed();
    if (!lastFailedArg.empty())
        cout << "failed argument : \"" << lastFailedArg << "\"";

    if (!errorMessage.empty())
        cout << " " + errorMessage;
    if (colored)
        resetCLI();

    cout << endl << endl;

}